

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O1

char * c_escape(char *str,curl_off_t len)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  ushort **ppuVar4;
  ulong uVar5;
  byte *__s;
  size_t sVar6;
  size_t sVar7;
  
  if (len == -1) {
    len = strlen(str);
  }
  sVar6 = 2000;
  if (len < 2000) {
    sVar6 = len;
  }
  uVar2 = (uint)(2000 < len) * 3;
  pbVar3 = (byte *)malloc((ulong)uVar2 + sVar6 * 4 + 1);
  if (pbVar3 == (byte *)0x0) {
    pbVar3 = (byte *)0x0;
  }
  else {
    __s = pbVar3;
    if (len != 0) {
      sVar7 = 0;
      do {
        bVar1 = str[sVar7];
        if (bVar1 < 0xd) {
          if (bVar1 == 9) {
            __s[2] = 0;
            __s[0] = 0x5c;
            __s[1] = 0x74;
            goto LAB_0011b67c;
          }
          if (bVar1 == 10) {
            __s[2] = 0;
            __s[0] = 0x5c;
            __s[1] = 0x6e;
            goto LAB_0011b67c;
          }
LAB_0011b68a:
          ppuVar4 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar4 + (ulong)bVar1 * 2 + 1) & 0x40) == 0) {
            curl_msnprintf(__s,5,"\\x%02x",bVar1);
            __s = __s + 4;
          }
          else {
            *__s = bVar1;
            __s = __s + 1;
          }
        }
        else {
          if (bVar1 == 0xd) {
            __s[2] = 0;
            __s[0] = 0x5c;
            __s[1] = 0x72;
          }
          else if (bVar1 == 0x22) {
            __s[2] = 0;
            __s[0] = 0x5c;
            __s[1] = 0x22;
          }
          else {
            if (bVar1 != 0x5c) goto LAB_0011b68a;
            __s[2] = 0;
            __s[0] = 0x5c;
            __s[1] = 0x5c;
          }
LAB_0011b67c:
          __s = __s + 2;
        }
        sVar7 = sVar7 + 1;
      } while (sVar6 != sVar7);
    }
    if (2000 < len) {
      uVar5 = (ulong)(uVar2 - 1);
      memset(__s,0x2e,uVar5 + 1);
      __s = __s + uVar5 + 1;
    }
    *__s = 0;
  }
  return (char *)pbVar3;
}

Assistant:

static char *c_escape(const char *str, curl_off_t len)
{
  const char *s;
  unsigned char c;
  char *escaped, *e;
  unsigned int cutoff = 0;

  if(len == ZERO_TERMINATED)
    len = strlen(str);

  if(len > MAX_STRING_LENGTH_OUTPUT) {
    /* cap ridiculously long strings */
    len = MAX_STRING_LENGTH_OUTPUT;
    cutoff = 3;
  }

  /* Allocate space based on worst-case */
  escaped = malloc(4 * (size_t)len + 1 + cutoff);
  if(!escaped)
    return NULL;

  e = escaped;
  for(s = str; len; s++, len--) {
    c = *s;
    if(c == '\n') {
      strcpy(e, "\\n");
      e += 2;
    }
    else if(c == '\r') {
      strcpy(e, "\\r");
      e += 2;
    }
    else if(c == '\t') {
      strcpy(e, "\\t");
      e += 2;
    }
    else if(c == '\\') {
      strcpy(e, "\\\\");
      e += 2;
    }
    else if(c == '"') {
      strcpy(e, "\\\"");
      e += 2;
    }
    else if(!isprint(c)) {
      msnprintf(e, 5, "\\x%02x", (unsigned)c);
      e += 4;
    }
    else
      *e++ = c;
  }
  while(cutoff--)
    *e++ = '.';
  *e = '\0';
  return escaped;
}